

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::SetSkyline
          (TPZSkylMatrix<std::complex<long_double>_> *this,TPZVec<long> *skyline)

{
  complex<long_double> *local_20;
  
  local_20 = (complex<long_double> *)0x0;
  TPZVec<std::complex<long_double>_*>::Fill(&this->fElem,&local_20,0,-1);
  InitializeElem(skyline,&this->fStorage,&this->fElem);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SetSkyline(const TPZVec<int64_t> &skyline)
{
#ifdef PZDEBUG
	for (int64_t i = 0 ; i < this->Rows() ; i++){
		if (skyline[i] < 0 || skyline[i] > i) DebugStop();
	}
#endif
	fElem.Fill(0);
	InitializeElem(skyline,fStorage,fElem);
}